

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

int slang::editDistance(string_view left,string_view right,bool allowReplacements,int maxDistance)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  undefined4 in_register_0000008c;
  ulong uVar11;
  uint *puVar12;
  int iVar13;
  SmallVectorBase<int> *unaff_R13;
  long lVar14;
  bool bVar15;
  SmallVector<int,_32UL> row;
  int local_fc;
  size_t local_f8;
  uint local_ec;
  undefined8 local_e8;
  size_t local_e0;
  uint *local_d8;
  int *local_d0;
  SmallVector<int,_32UL> local_c8;
  
  local_e8 = CONCAT44(in_register_0000008c,maxDistance);
  local_e0 = left._M_len;
  sVar5 = right._M_len;
  SmallVector<int,_32UL>::SmallVector(&local_c8,sVar5);
  local_fc = 0;
  local_f8 = sVar5;
  if (-1 < (int)right._M_len) {
    unaff_R13 = &local_c8.super_SmallVectorBase<int>;
    do {
      SmallVectorBase<int>::emplace_back<int_const&>(unaff_R13,&local_fc);
      iVar13 = local_fc + 1;
      bVar15 = local_fc < (int)local_f8;
      local_fc = iVar13;
    } while (bVar15);
  }
  iVar13 = (int)unaff_R13;
  bVar15 = local_e0 == 0;
  if (!bVar15) {
    uVar6 = 2;
    if (2 < local_f8 + 1) {
      uVar6 = local_f8 + 1;
    }
    iVar3 = (int)local_e8;
    local_ec = iVar3 + 1;
    local_d0 = local_c8.super_SmallVectorBase<int>.data_;
    local_d8 = (uint *)(local_c8.super_SmallVectorBase<int>.data_ + 1);
    uVar10 = 1;
    do {
      iVar9 = (int)uVar10;
      *local_c8.super_SmallVectorBase<int>.data_ = iVar9;
      if (local_f8 != 0) {
        uVar1 = uVar10 - 1;
        lVar14 = 0;
        uVar7 = uVar1 & 0xffffffff;
        uVar11 = uVar10 & 0xffffffff;
        puVar12 = local_d8;
        do {
          uVar8 = (uint)uVar7;
          uVar2 = *puVar12;
          uVar7 = (ulong)uVar2;
          if (allowReplacements) {
            uVar8 = uVar8 + (left._M_str[uVar1] != right._M_str[lVar14]);
            puVar4 = puVar12 + -1;
            if ((int)uVar2 < (int)puVar12[-1]) {
              puVar4 = puVar12;
            }
            if ((int)(*puVar4 + 1) < (int)uVar8) {
              uVar8 = *puVar4 + 1;
            }
          }
          else if (left._M_str[uVar1] != right._M_str[lVar14]) {
            puVar4 = puVar12 + -1;
            if ((int)uVar2 < (int)puVar12[-1]) {
              puVar4 = puVar12;
            }
            uVar8 = *puVar4 + 1;
          }
          if ((int)uVar8 < (int)uVar11) {
            uVar11 = (ulong)uVar8;
          }
          iVar9 = (int)uVar11;
          *puVar12 = uVar8;
          lVar14 = lVar14 + 1;
          puVar12 = puVar12 + 1;
        } while (uVar6 - 1 != lVar14);
      }
      unaff_R13 = (SmallVectorBase<int> *)((ulong)unaff_R13 & 0xffffffff);
      if (iVar3 < iVar9 && iVar3 != 0) {
        unaff_R13 = (SmallVectorBase<int> *)(ulong)local_ec;
      }
      iVar13 = (int)unaff_R13;
      if (iVar3 < iVar9 && iVar3 != 0) break;
      uVar10 = uVar10 + 1;
      bVar15 = local_e0 < uVar10;
    } while (uVar10 <= local_e0);
  }
  if (bVar15) {
    iVar13 = local_c8.super_SmallVectorBase<int>.data_[local_f8];
  }
  if (local_c8.super_SmallVectorBase<int>.data_ !=
      (pointer)local_c8.super_SmallVectorBase<int>.firstElement) {
    operator_delete(local_c8.super_SmallVectorBase<int>.data_);
  }
  return iVar13;
}

Assistant:

int editDistance(std::string_view left, std::string_view right, bool allowReplacements,
                 int maxDistance) {
    // See: http://en.wikipedia.org/wiki/Levenshtein_distance
    size_t m = left.size();
    size_t n = right.size();

    SmallVector<int, 32> row(n, UninitializedTag());
    for (int i = 0; i <= int(n); i++)
        row.push_back(i);

    for (size_t y = 1; y <= m; y++) {
        row[0] = int(y);
        int best = row[0];

        int prev = int(y - 1);
        for (size_t x = 1; x <= n; x++) {
            int old = row[x];
            if (allowReplacements) {
                row[x] = std::min(prev + (left[y - 1] == right[x - 1] ? 0 : 1),
                                  std::min(row[x - 1], row[x]) + 1);
            }
            else {
                if (left[y - 1] == right[x - 1])
                    row[x] = prev;
                else
                    row[x] = std::min(row[x - 1], row[x]) + 1;
            }

            prev = old;
            best = std::min(best, row[x]);
        }

        if (maxDistance && best > maxDistance)
            return maxDistance + 1;
    }

    return row[n];
}